

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pyraminx.cpp
# Opt level: O3

void __thiscall Pyraminx::turn_layer(Pyraminx *this,Corner corner,int layer,Direction dir)

{
  Face *this_00;
  shared_ptr<Face> *psVar1;
  Corner corner_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_110 [2];
  Face *local_100;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_f8;
  Face *local_f0;
  _Base_ptr local_e8;
  undefined1 local_e0 [64];
  vector<Color,_std::allocator<Color>_> local_a0;
  vector<Color,_std::allocator<Color>_> local_88;
  vector<Color,_std::allocator<Color>_> local_70;
  vector<Color,_std::allocator<Color>_> local_58;
  vector<Color,_std::allocator<Color>_> local_40;
  
  if (layer == 2) {
    dir = (Direction)(dir == clockwise);
    turn_layer(this,corner,0,dir);
    turn_layer(this,corner,1,dir);
    layer = 3;
  }
  a_Stack_110[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  psVar1 = &this->blue_face;
  if (corner == B) {
    psVar1 = &this->green_face;
  }
  this_00 = (psVar1->super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  psVar1 = &this->green_face;
  if (corner != B) {
    psVar1 = &this->blue_face;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (a_Stack_110,&(psVar1->super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>)._M_refcount
            );
  corner_00 = (Corner)this_00;
  Face::get_sending_neighbor((Face *)&local_100,corner_00,corner);
  Face::get_receiving_neighbor((Face *)&local_f0,corner_00,corner);
  Face::get_layer(&local_58,local_100,corner,layer);
  std::vector<Color,_std::allocator<Color>_>::vector(&local_88,&local_58);
  Face::update_layer(&local_70,this_00,corner,layer,&local_88);
  if (local_88.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_88.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::vector<Color,_std::allocator<Color>_>::vector
            ((vector<Color,_std::allocator<Color>_> *)(local_e0 + 0x28),&local_70);
  Face::update_layer(&local_a0,local_f0,corner,layer,
                     (vector<Color,_std::allocator<Color>_> *)(local_e0 + 0x28));
  if ((element_type *)local_e0._40_8_ != (element_type *)0x0) {
    operator_delete((void *)local_e0._40_8_);
  }
  std::vector<Color,_std::allocator<Color>_>::vector
            ((vector<Color,_std::allocator<Color>_> *)(local_e0 + 0x10),&local_a0);
  Face::update_layer(&local_40,local_100,corner,layer,
                     (vector<Color,_std::allocator<Color>_> *)(local_e0 + 0x10));
  if (local_40.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_40.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((_Base_ptr)local_e0._16_8_ != (_Base_ptr)0x0) {
    operator_delete((void *)local_e0._16_8_);
  }
  if (layer == 3) {
    get_opposite_face((Pyraminx *)local_e0,(Corner)this);
    Face::turn_face((Face *)local_e0._0_8_,(uint)(dir == clockwise));
    if ((_Base_ptr)local_e0._8_8_ != (_Base_ptr)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e0._8_8_);
    }
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_a0.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.super__Vector_impl_data.
      _M_start != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    operator_delete(local_a0.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_70.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_70.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_58.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_58.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_e8 != (_Base_ptr)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8);
  }
  if (local_f8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_f8);
  }
  if (a_Stack_110[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_110[0]._M_pi);
  }
  return;
}

Assistant:

void Pyraminx::turn_layer(Corner corner, int layer, Direction dir){
    // To keep the middle piece fixed in our view,
    // treat middle layer twists as counter-twists of all other layers
    if(layer == 2){
        if(dir == Direction::clockwise){
            dir = Direction::counterclockwise;
        }
        else{
            dir = Direction::clockwise;
        }
        turn_layer(corner, 0, dir);
        turn_layer(corner, 1, dir);
        turn_layer(corner, 3, dir);
    }
    else{
        // If we are turning from the back corner, treat 
        // the green face as the reference face. 
        // Otherwise use the blue face as the reference.
        std::shared_ptr<Face> ref_face;
        if(corner == Corner::B){
            ref_face = green_face;
        }
        else{
            ref_face = blue_face;
        }
        std::shared_ptr<Face> sending_face = ref_face->get_sending_neighbor(corner, dir);
        std::shared_ptr<Face> receiving_face = ref_face->get_receiving_neighbor(corner, dir);
        std::vector<Color> sender_color = sending_face->get_layer(corner, layer);
        std::vector<Color> old_color = ref_face->update_layer(corner, layer, sender_color);
        std::vector<Color> receiver_old_color = receiving_face->update_layer(corner, layer, old_color);
        sending_face->update_layer(corner, layer, receiver_old_color);

        // If we rotate a base layer, we are also rotating the face 
        // opposite the corner in the reverse direction
        if(layer == 3){
            if(dir == Direction::clockwise){
                dir = Direction::counterclockwise;
            }
            else{
                dir = Direction::clockwise;
            }
            get_opposite_face(corner)->turn_face(dir);
        }
    }
}